

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O1

void __thiscall LinearExpert::LinearExpert(LinearExpert *this,int d,int D,Z *z,X *x,IMLE *_mixture)

{
  X *this_00;
  Z *pZVar1;
  double *pdVar2;
  double *pdVar3;
  double **ppdVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  IMLE *pIVar7;
  double dVar8;
  int iVar9;
  double *pdVar10;
  undefined8 *puVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  ulong uVar18;
  ActualDstType actualDst_1;
  long lVar19;
  ActualDstType actualDst_4;
  ActualDstType actualDst;
  Scal SVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  Z sigma0;
  ThisEvaluator thisEval;
  assign_op<double,_double> local_7e;
  char local_7d;
  int local_7c;
  Z *local_78;
  undefined8 uStack_70;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_68;
  X *local_50;
  DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_48;
  
  this->d = d;
  this->D = D;
  (this->dGamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->dGamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->Mu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Mu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->Lambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Lambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->Lambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->invSigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->invSigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->invSigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->Sxz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Sxz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->Sxz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->Sxx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Sxx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->Nu0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Nu0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  (this->pred_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->pred_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  local_7c = d;
  local_50 = x;
  memset(&this->dNewGamma,0,0x88);
  (this->varLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->varLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->varLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->PsiLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->PsiLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->PsiLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  (this->LambdaPsiLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
  .m_data = (double *)0x0;
  (this->LambdaPsiLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
  .m_rows = 0;
  (this->LambdaPsiLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
  .m_cols = 0;
  (this->p_x_invVar).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->p_x_invVar).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->p_x_invVar).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  this->mixture = _mixture;
  this->alpha = (_mixture->param).alpha;
  this->wPsi = (_mixture->param).wPsi;
  uVar5 = (_mixture->param).wSigma;
  uVar6 = (_mixture->param).wNu;
  auVar22._8_4_ = (int)uVar5;
  auVar22._0_8_ = uVar6;
  auVar22._12_4_ = (int)((ulong)uVar5 >> 0x20);
  this->wNu = (Scal)uVar6;
  this->wSigma = (Scal)auVar22._8_8_;
  this->wLambda = (_mixture->param).wLambda;
  pdVar10 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  lVar15 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_78 = z;
  if ((this->Nu0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      lVar15) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->Nu0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar15,1)
    ;
  }
  iVar9 = local_7c;
  pdVar17 = (this->Nu0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar14 = (this->Nu0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar12 = uVar14 - ((long)uVar14 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar14) {
    lVar15 = 0;
    do {
      pdVar2 = pdVar10 + lVar15;
      dVar24 = pdVar2[1];
      pdVar3 = pdVar17 + lVar15;
      *pdVar3 = *pdVar2;
      pdVar3[1] = dVar24;
      lVar15 = lVar15 + 2;
    } while (lVar15 < (long)uVar12);
  }
  if ((long)uVar12 < (long)uVar14) {
    do {
      pdVar17[uVar12] = pdVar10[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar14 != uVar12);
  }
  pZVar1 = &this->Sz;
  this->H = 1e-06;
  this->Sh = 0.0;
  lVar15 = (long)local_7c;
  if ((this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      lVar15) {
    free((pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data);
    if (iVar9 < 1) {
      pdVar10 = (double *)0x0;
    }
    else {
      pdVar10 = (double *)malloc(lVar15 * 8);
      if (pdVar10 == (double *)0x0) goto LAB_00151b4d;
    }
    (pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         pdVar10;
  }
  (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       lVar15;
  if (0 < local_7c) {
    memset((pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           ,0,lVar15 * 8);
  }
  lVar19 = (long)D;
  if ((this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      lVar19) {
    free((this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
    ;
    if (D < 1) {
      pdVar10 = (double *)0x0;
    }
    else {
      pdVar10 = (double *)malloc(lVar19 * 8);
      if (pdVar10 == (double *)0x0) goto LAB_00151b4d;
    }
    (this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar10;
  }
  (this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       lVar19;
  if (0 < D) {
    memset((this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data,0,lVar19 * 8);
  }
  local_7d = local_7c == 0 || D == 0;
  if (((bool)local_7d) ||
     (lVar19 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar15),0))) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->Sxz,lVar19 * lVar15,lVar19,lVar15);
    lVar13 = (this->Sxz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols * (this->Sxz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows;
    if (0 < lVar13) {
      memset((this->Sxz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data,0,lVar13 * 8);
    }
    if ((this->Sxx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != lVar19) {
      free((this->Sxx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      if (D < 1) {
        pdVar10 = (double *)0x0;
      }
      else {
        pdVar10 = (double *)malloc(lVar19 * 8);
        if (pdVar10 == (double *)0x0) goto LAB_00151b4d;
      }
      (this->Sxx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar10;
    }
    (this->Sxx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         lVar19;
    if (0 < D) {
      memset((this->Sxx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data,0,lVar19 * 8);
    }
    if ((local_7c != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar15),0) < lVar15)) {
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar11 = operator_delete;
      __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->Szz,lVar15 * lVar15,lVar15,lVar15);
    auVar23 = _DAT_0018b020;
    auVar22 = _DAT_0018b010;
    pdVar10 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
              .m_data;
    lVar13 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
    uVar14 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
    if (0 < (long)uVar14) {
      lVar16 = lVar13 + -1;
      auVar21._8_4_ = (int)lVar16;
      auVar21._0_8_ = lVar16;
      auVar21._12_4_ = (int)((ulong)lVar16 >> 0x20);
      pdVar17 = pdVar10 + 1;
      uVar12 = 0;
      auVar21 = auVar21 ^ _DAT_0018b020;
      do {
        if (0 < lVar13) {
          uVar18 = 0;
          auVar25 = auVar22;
          do {
            auVar27 = auVar25 ^ auVar23;
            if ((bool)(~(auVar21._4_4_ < auVar27._4_4_ ||
                        auVar21._0_4_ < auVar27._0_4_ && auVar27._4_4_ == auVar21._4_4_) & 1)) {
              dVar24 = 1.0;
              if (uVar12 != uVar18) {
                dVar24 = 0.0;
              }
              pdVar17[uVar18 - 1] = dVar24;
            }
            if (auVar27._12_4_ <= auVar21._12_4_ &&
                (auVar27._8_4_ <= auVar21._8_4_ || auVar27._12_4_ != auVar21._12_4_)) {
              dVar24 = 1.0;
              if (uVar12 - 1 != uVar18) {
                dVar24 = 0.0;
              }
              pdVar17[uVar18] = dVar24;
            }
            uVar18 = uVar18 + 2;
            lVar16 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 2;
            auVar25._8_8_ = lVar16 + 2;
          } while ((lVar13 + 1U & 0xfffffffffffffffe) != uVar18);
        }
        uVar12 = uVar12 + 1;
        pdVar17 = pdVar17 + lVar13;
      } while (uVar12 != uVar14);
    }
    lVar13 = uVar14 * lVar13;
    uVar14 = lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar13) {
      lVar16 = 0;
      do {
        dVar24 = (pdVar10 + lVar16)[1];
        pdVar10[lVar16] = pdVar10[lVar16] * 1e-06;
        (pdVar10 + lVar16)[1] = dVar24 * 1e-06;
        lVar16 = lVar16 + 2;
      } while (lVar16 < (long)uVar14);
    }
    if ((long)uVar14 < lVar13) {
      do {
        pdVar10[uVar14] = pdVar10[uVar14] * 1e-06;
        uVar14 = uVar14 + 1;
      } while (lVar13 - uVar14 != 0);
    }
    pdVar10 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    lVar13 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if ((this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != lVar13) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar13,1
                );
    }
    pdVar17 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
    uVar14 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    uVar12 = uVar14 - ((long)uVar14 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar14) {
      lVar13 = 0;
      do {
        pdVar2 = pdVar10 + lVar13;
        dVar24 = pdVar2[1];
        pdVar3 = pdVar17 + lVar13;
        *pdVar3 = *pdVar2;
        pdVar3[1] = dVar24;
        lVar13 = lVar13 + 2;
      } while (lVar13 < (long)uVar12);
    }
    if ((long)uVar12 < (long)uVar14) {
      do {
        pdVar17[uVar12] = pdVar10[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar14 != uVar12);
    }
    pdVar10 = (local_50->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    lVar13 = (local_50->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if ((this->Mu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != lVar13) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->Mu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar13,1
                );
    }
    pdVar17 = (this->Mu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
    uVar14 = (this->Mu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    uVar12 = uVar14 - ((long)uVar14 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar14) {
      lVar13 = 0;
      do {
        pdVar2 = pdVar10 + lVar13;
        dVar24 = pdVar2[1];
        pdVar3 = pdVar17 + lVar13;
        *pdVar3 = *pdVar2;
        pdVar3[1] = dVar24;
        lVar13 = lVar13 + 2;
      } while (lVar13 < (long)uVar12);
    }
    if ((long)uVar12 < (long)uVar14) {
      do {
        pdVar17[uVar12] = pdVar10[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar14 != uVar12);
    }
    if ((local_7d != '\0') ||
       (lVar19 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar15),0))) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&this->Lambda,lVar19 * lVar15,lVar19,lVar15)
      ;
      lVar19 = (this->Lambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols *
               (this->Lambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      if (0 < lVar19) {
        memset((this->Lambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data,0,lVar19 * 8);
      }
      local_78 = (Z *)(1.0 / this->wLambda);
      if (((this->varLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows != lVar15) ||
         ((this->varLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols != lVar15)) {
        if ((local_7c != 0) &&
           (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar15),0) < lVar15)
           ) {
          puVar11 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar11 = operator_delete;
          __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)&this->varLambda,lVar15 * lVar15,lVar15,
                   lVar15);
      }
      iVar9 = local_7c;
      auVar23 = _DAT_0018b020;
      auVar22 = _DAT_0018b010;
      uVar14 = (this->varLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols;
      if (0 < (long)uVar14) {
        lVar19 = (this->varLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        lVar15 = lVar19 + -1;
        auVar27._8_4_ = (int)lVar15;
        auVar27._0_8_ = lVar15;
        auVar27._12_4_ = (int)((ulong)lVar15 >> 0x20);
        pdVar10 = (this->varLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  .m_storage.m_data + 1;
        uVar12 = 0;
        auVar27 = auVar27 ^ _DAT_0018b020;
        do {
          if (0 < lVar19) {
            uVar18 = 0;
            auVar26 = auVar22;
            do {
              auVar21 = auVar26 ^ auVar23;
              if ((bool)(~(auVar27._4_4_ < auVar21._4_4_ ||
                          auVar27._0_4_ < auVar21._0_4_ && auVar21._4_4_ == auVar27._4_4_) & 1)) {
                dVar24 = 1.0;
                if (uVar12 != uVar18) {
                  dVar24 = 0.0;
                }
                pdVar10[uVar18 - 1] = dVar24 * (double)local_78;
              }
              if (auVar21._12_4_ <= auVar27._12_4_ &&
                  (auVar21._8_4_ <= auVar27._8_4_ || auVar21._12_4_ != auVar27._12_4_)) {
                dVar24 = 1.0;
                if (uVar12 - 1 != uVar18) {
                  dVar24 = 0.0;
                }
                pdVar10[uVar18] = dVar24 * (double)local_78;
              }
              uVar18 = uVar18 + 2;
              lVar15 = auVar26._8_8_;
              auVar26._0_8_ = auVar26._0_8_ + 2;
              auVar26._8_8_ = lVar15 + 2;
            } while ((lVar19 + 1U & 0xfffffffffffffffe) != uVar18);
          }
          uVar12 = uVar12 + 1;
          pdVar10 = pdVar10 + lVar19;
        } while (uVar12 != uVar14);
      }
      local_78 = (Z *)this->wSigma;
      uStack_70 = 0;
      pIVar7 = this->mixture;
      local_68.m_storage.m_data = (double *)0x0;
      local_68.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&local_68,
                 (pIVar7->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows,1);
      pdVar10 = (pIVar7->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      uVar14 = (pIVar7->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
      if (local_68.m_storage.m_rows != uVar14) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_68,uVar14,1);
      }
      dVar24 = (double)local_78 / ((double)iVar9 + (double)local_78 + 2.0);
      uVar14 = local_68.m_storage.m_rows - (local_68.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
      if (1 < local_68.m_storage.m_rows) {
        lVar15 = 0;
        do {
          pdVar17 = pdVar10 + lVar15;
          dVar8 = pdVar17[1];
          ppdVar4 = &((DenseStorage<double,__1,__1,_1,_0> *)local_68.m_storage.m_data)->m_data +
                    lVar15;
          *ppdVar4 = (double *)(*pdVar17 * dVar24);
          ppdVar4[1] = (double *)(dVar8 * dVar24);
          lVar15 = lVar15 + 2;
        } while (lVar15 < (long)uVar14);
      }
      if ((long)uVar14 < local_68.m_storage.m_rows) {
        do {
          (&((DenseStorage<double,__1,__1,_1,_0> *)local_68.m_storage.m_data)->m_data)[uVar14] =
               (double *)(pdVar10[uVar14] * dVar24);
          uVar14 = uVar14 + 1;
        } while (local_68.m_storage.m_rows != uVar14);
      }
      local_48._0_8_ = &local_68;
      if ((local_68.m_storage.m_rows != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                 SEXT816(local_68.m_storage.m_rows),0) < local_68.m_storage.m_rows)) {
        puVar11 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar11 = operator_delete;
        __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&this->Sigma,
                 local_68.m_storage.m_rows * local_68.m_storage.m_rows,local_68.m_storage.m_rows,
                 local_68.m_storage.m_rows);
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Diagonal2Dense,_void>
      ::run(&this->Sigma,(DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_48
            ,&local_7e);
      local_48.m_diagonal.m_xpr = (XprTypeNested)&local_68;
      if ((local_68.m_storage.m_rows != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                 SEXT816(local_68.m_storage.m_rows),0) < local_68.m_storage.m_rows)) {
        puVar11 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar11 = operator_delete;
        __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&this->invSigma,
                 local_68.m_storage.m_rows * local_68.m_storage.m_rows,local_68.m_storage.m_rows,
                 local_68.m_storage.m_rows);
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Diagonal2Dense,_void>
      ::run(&this->invSigma,&local_48,&local_7e);
      dVar24 = 1.0;
      if (local_68.m_storage.m_rows != 0) {
        local_48._0_8_ = local_68.m_storage.m_data;
        dVar24 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
                 ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                           ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_48,
                            (scalar_product_op<double,_double> *)&local_7e,
                            (Matrix<double,__1,_1,_0,__1,_1> *)&local_68);
      }
      dVar24 = 1.0 / dVar24;
      if (dVar24 < 0.0) {
        SVar20 = sqrt(dVar24);
      }
      else {
        SVar20 = SQRT(dVar24);
      }
      this->sqrtDetInvSigma = SVar20;
      local_78 = (Z *)(2.0 / this->wPsi);
      uStack_70 = 0;
      pdVar10 = (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      lVar15 = (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
      if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows != lVar15) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&(this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                   lVar15,1);
      }
      auVar23._0_8_ = (double)local_78 + 1.0;
      pdVar17 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                .m_data;
      uVar14 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      uVar12 = uVar14 - ((long)uVar14 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar14) {
        auVar23._8_8_ = auVar23._0_8_;
        lVar15 = 0;
        do {
          auVar22 = divpd(*(undefined1 (*) [16])(pdVar10 + lVar15),auVar23);
          *(undefined1 (*) [16])(pdVar17 + lVar15) = auVar22;
          lVar15 = lVar15 + 2;
        } while (lVar15 < (long)uVar12);
      }
      if ((long)uVar12 < (long)uVar14) {
        do {
          pdVar17[uVar12] = pdVar10[uVar12] / auVar23._0_8_;
          uVar12 = uVar12 + 1;
        } while (uVar14 != uVar12);
      }
      this_00 = &this->invPsi;
      pdVar10 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                .m_data;
      lVar15 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      local_78 = (Z *)auVar23._0_8_;
      if ((this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows != lVar15) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar15,1
                  );
      }
      auVar22 = _DAT_0018cd00;
      pdVar17 = (this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      uVar14 = (this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
      uVar12 = uVar14 - ((long)uVar14 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar14) {
        lVar15 = 0;
        do {
          auVar23 = divpd(auVar22,*(undefined1 (*) [16])(pdVar10 + lVar15));
          *(undefined1 (*) [16])(pdVar17 + lVar15) = auVar23;
          lVar15 = lVar15 + 2;
        } while (lVar15 < (long)uVar12);
      }
      if ((long)uVar12 < (long)uVar14) {
        do {
          pdVar17[uVar12] = 1.0 / pdVar10[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar14 != uVar12);
      }
      if ((this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows == 0) {
        dVar24 = 1.0;
      }
      else {
        local_48._0_8_ =
             (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
        dVar24 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
                 ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                           ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_48,
                            (scalar_product_op<double,_double> *)&local_7e,this_00);
      }
      if (dVar24 < 0.0) {
        SVar20 = sqrt(dVar24);
      }
      else {
        SVar20 = SQRT(dVar24);
      }
      this->sqrtDetInvPsi = SVar20;
      this->recompute = true;
      free(local_68.m_storage.m_data);
      return;
    }
  }
LAB_00151b4d:
  puVar11 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar11 = operator_delete;
  __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

LINEAR_EXPERT_base::LinearExpert(Z const &z, X const &x, IMLE<d,D,::LinearExpert> *_mixture)
#endif
{
    mixture = _mixture;

    alpha = mixture->getParameters().alpha;
    wPsi = mixture->getParameters().wPsi;
    wNu = mixture->getParameters().wNu;
    wSigma = mixture->getParameters().wSigma;
    wLambda = mixture->getParameters().wLambda;

    Nu0 = z;


    H = EPSILON;

    Sh = 0.0;
    Sz.setZero(d);
    Sx.setZero(D);
    Sxz.setZero(D,d);
    Sxx.setZero(D);
    Szz.setIdentity(d,d) *= EPSILON;


    Nu = z;
    Mu = x;
    Lambda.setZero(D,d);
    varLambda = 1.0/wLambda * ZZ::Identity(d,d);

    Z sigma0 = wSigma/(wSigma+d+2.0)*mixture->getSigma();
    Sigma = sigma0.asDiagonal();
    invSigma = sigma0.cwiseInverse().asDiagonal();
    sqrtDetInvSigma = sqrt( 1.0 / sigma0.prod() );
//    Sigma.setIdentity(d,d) *=  wSigma*mixture->sigma/(wSigma+d+2.0);
//    invSigma.setIdentity(d,d) *=  (wSigma+d+2.0)/(wSigma*mixture->sigma);
//    sqrtDetInvSigma = pow((wSigma+d+2.0)/(wSigma*mixture->sigma), d/2.0);
    Psi = mixture->getPsi() / (1.0 + 2.0/wPsi) ;
    invPsi = Psi.cwiseInverse();
    sqrtDetInvPsi = sqrt(invPsi.prod());


    recompute = true;
}